

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O1

char * zt_cstr_catv(char *s,...)

{
  int iVar1;
  char in_AL;
  ulong uVar2;
  void **ppvVar3;
  size_t sVar4;
  char *pcVar5;
  void **ppvVar6;
  uint uVar7;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long lVar8;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar9;
  void **ppvVar10;
  long lVar11;
  long lVar12;
  size_t num;
  char *pcVar13;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  uint local_108;
  void **local_100;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  ppvVar6 = &ap[0].overflow_arg_area;
  local_e8[1] = (void *)in_RSI;
  local_e8[2] = (void *)in_RDX;
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (s == (char *)0x0) {
    num = 1;
  }
  else {
    local_108 = 8;
    lVar12 = 0;
    pcVar13 = s;
    do {
      if (local_108 < 0x29) {
        uVar2 = (ulong)local_108;
        local_108 = local_108 + 8;
        ppvVar3 = (void **)((long)local_e8 + uVar2);
        ppvVar10 = ppvVar6;
      }
      else {
        ppvVar10 = ppvVar6 + 1;
        ppvVar3 = ppvVar6;
      }
      iVar1 = *(int *)ppvVar3;
      lVar9 = (long)iVar1;
      if (local_108 < 0x29) {
        uVar2 = (ulong)local_108;
        local_108 = local_108 + 8;
        ppvVar6 = (void **)((long)local_e8 + uVar2);
        ppvVar3 = ppvVar10;
      }
      else {
        ppvVar3 = ppvVar10 + 1;
        ppvVar6 = ppvVar10;
      }
      sVar4 = strlen(pcVar13);
      if (sVar4 == 0) {
        lVar9 = 0;
      }
      else {
        if (iVar1 < 0) {
          lVar11 = sVar4 - 1;
          if ((long)(lVar9 + sVar4) < (long)sVar4) {
            lVar11 = lVar9 + sVar4;
          }
        }
        else {
          lVar11 = sVar4 - 1;
          if (lVar9 < (long)sVar4) {
            lVar11 = lVar9;
          }
        }
        lVar8 = (long)*(int *)ppvVar6;
        if (*(int *)ppvVar6 < 0) {
          lVar9 = sVar4 - 1;
          if ((long)(lVar8 + sVar4) < (long)sVar4) {
            lVar9 = lVar8 + sVar4;
          }
        }
        else {
          lVar9 = sVar4 - 1;
          if (lVar8 < (long)sVar4) {
            lVar9 = lVar8;
          }
        }
        lVar8 = lVar9;
        if (lVar9 < lVar11) {
          lVar8 = lVar11;
        }
        if (lVar11 < lVar9) {
          lVar9 = lVar11;
        }
        lVar9 = lVar9 - lVar8;
      }
      lVar11 = -lVar9;
      if (0 < lVar9) {
        lVar11 = lVar9;
      }
      if (local_108 < 0x29) {
        uVar2 = (ulong)local_108;
        local_108 = local_108 + 8;
        ppvVar6 = ppvVar3;
        ppvVar3 = (void **)((long)local_e8 + uVar2);
      }
      else {
        ppvVar6 = ppvVar3 + 1;
      }
      lVar11 = lVar12 + lVar11;
      lVar12 = lVar11 + 2;
      pcVar13 = (char *)*ppvVar3;
    } while (pcVar13 != (char *)0x0);
    num = lVar11 + 3;
  }
  local_100 = &ap[0].overflow_arg_area;
  pcVar5 = (char *)zt_malloc_p(num);
  uVar7 = 8;
  pcVar13 = pcVar5;
  if (s != (char *)0x0) {
    do {
      uVar2 = (ulong)uVar7;
      if (uVar2 < 0x29) {
        uVar7 = uVar7 + 8;
        ppvVar6 = (void **)((long)local_e8 + uVar2);
      }
      else {
        ppvVar6 = local_100;
        local_100 = local_100 + 1;
      }
      iVar1 = *(int *)ppvVar6;
      lVar12 = (long)iVar1;
      uVar2 = (ulong)uVar7;
      if (uVar2 < 0x29) {
        uVar7 = uVar7 + 8;
        ppvVar6 = (void **)((long)local_e8 + uVar2);
      }
      else {
        ppvVar6 = local_100;
        local_100 = local_100 + 1;
      }
      sVar4 = strlen(s);
      if (sVar4 == 0) {
        lVar12 = 0;
        lVar9 = 0;
      }
      else {
        if (iVar1 < 0) {
          lVar11 = sVar4 - 1;
          if ((long)(lVar12 + sVar4) < (long)sVar4) {
            lVar11 = lVar12 + sVar4;
          }
        }
        else {
          lVar11 = sVar4 - 1;
          if (lVar12 < (long)sVar4) {
            lVar11 = lVar12;
          }
        }
        lVar12 = (long)*(int *)ppvVar6;
        if (*(int *)ppvVar6 < 0) {
          lVar9 = sVar4 - 1;
          if ((long)(lVar12 + sVar4) < (long)sVar4) {
            lVar9 = lVar12 + sVar4;
          }
        }
        else {
          lVar9 = sVar4 - 1;
          if (lVar12 < (long)sVar4) {
            lVar9 = lVar12;
          }
        }
        lVar12 = lVar9;
        if (lVar9 < lVar11) {
          lVar12 = lVar11;
        }
        if (lVar11 < lVar9) {
          lVar9 = lVar11;
        }
      }
      if (lVar9 <= lVar12) {
        lVar11 = 0;
        do {
          pcVar13[lVar11] = s[lVar11 + lVar9];
          lVar11 = lVar11 + 1;
        } while ((lVar12 - lVar9) + 1 != lVar11);
        pcVar13 = pcVar13 + lVar11;
      }
      uVar2 = (ulong)uVar7;
      if (uVar2 < 0x29) {
        uVar7 = uVar7 + 8;
        ppvVar6 = (void **)((long)local_e8 + uVar2);
      }
      else {
        ppvVar6 = local_100;
        local_100 = local_100 + 1;
      }
      s = (char *)*ppvVar6;
    } while (s != (char *)0x0);
  }
  *pcVar13 = '\0';
  return pcVar5;
}

Assistant:

char *
zt_cstr_catv(const char *s, ...) {
    char       * new;
    char       * p;
    const char * save = s;
    ssize_t      i;
    ssize_t      j;
    size_t       len  = 0;
    va_list      ap;

    va_start(ap, s);

    /* calculate the lentgh */
    while (s) {
        i    = va_arg(ap, int);
        j    = va_arg(ap, int);
        CONVERT(s, i, j);
        len += IDXLEN(i, j) + 1;
        s    = va_arg(ap, const char *);
    }

    va_end(ap);

    p = new = zt_malloc(char, len + 1);
    s = save;
    va_start(ap, s);

    while (s) {
        i = va_arg(ap, int);
        j = va_arg(ap, int);
        CONVERT(s, i, j);

        while (i <= j) {
            *p++ = s[i++];
        }
        s = va_arg(ap, const char *);
    }

    *p = '\0';
    return new;
}